

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleGlobalMode(cmSetPropertyCommand *this)

{
  char *pcVar1;
  char *this_00;
  bool bVar2;
  char *local_e8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  char *local_68;
  char *value;
  char *name;
  cmake *cm;
  allocator local_39;
  string local_38;
  cmSetPropertyCommand *local_18;
  cmSetPropertyCommand *this_local;
  
  local_18 = this;
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Names);
  if (bVar2) {
    name = (char *)cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    value = (char *)std::__cxx11::string::c_str();
    local_68 = (char *)std::__cxx11::string::c_str();
    this_00 = name;
    pcVar1 = value;
    if ((this->Remove & 1U) != 0) {
      local_68 = (char *)0x0;
    }
    if ((this->AppendMode & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_b1);
      cmake::SetProperty((cmake *)this_00,&local_b0,local_68);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
      if (local_68 == (char *)0x0) {
        local_e8 = "";
      }
      else {
        local_e8 = local_68;
      }
      cmake::AppendProperty((cmake *)this_00,&local_88,local_e8,(bool)(this->AppendAsString & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"given names for GLOBAL scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmSetPropertyCommand::HandleGlobalMode()
{
  if(!this->Names.empty())
    {
    this->SetError("given names for GLOBAL scope.");
    return false;
    }

  // Set or append the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    cm->AppendProperty(name, value ? value : "", this->AppendAsString);
    }
  else
    {
    cm->SetProperty(name, value);
    }

  return true;
}